

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void predict(log_multi *b,single_learner *base,example *ec)

{
  label_t lVar1;
  node *pnVar2;
  uint uVar3;
  
  lVar1 = (ec->l).multi;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar2 = (b->nodes)._begin;
  uVar3 = 0;
  while( true ) {
    if (pnVar2[uVar3].internal != true) break;
    LEARNER::learner<char,_example>::predict(base,ec,(ulong)pnVar2[uVar3].base_predictor);
    pnVar2 = (b->nodes)._begin;
    uVar3 = (&pnVar2[uVar3].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
  }
  (ec->pred).scalar = (float)pnVar2[uVar3].max_count_label;
  (ec->l).multi = lVar1;
  return;
}

Assistant:

void predict(log_multi& b, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  uint32_t cn = 0;
  uint32_t depth = 0;
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_predictor);  // depth
    cn = descend(b.nodes[cn], ec.pred.scalar);
    depth++;
  }
  ec.pred.multiclass = b.nodes[cn].max_count_label;
  ec.l.multi = mc;
}